

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O2

void prsxgen_pia(prscxdef *ctx)

{
  prsndef *n;
  
  n = prsexpr(ctx);
  if (((n != (prsndef *)0x0 & (byte)ctx->prscxtok->tokcxflg >> 2) == 1) && (n->prsntyp == 0x9e)) {
    errlogf(ctx->prscxerr,"TADS",0x166);
  }
  prsgexp(ctx,n);
  ctx->prscxnode = ctx->prscxnrst;
  ctx->prscxnrem = ctx->prscxrrst;
  return;
}

Assistant:

void prsxgen_pia(prscxdef *ctx)
{
    prsndef *exprnode;

    /* parse the expression */
    exprnode = prsexpr(ctx);

    /* check for a possibly incorrect assignment if in C mode */
    if ((ctx->prscxtok->tokcxflg & TOKCXFCMODE)
        && exprnode && exprnode->prsntyp == TOKTASSIGN)
        errlog(ctx->prscxerr, ERR_PIA);

    /* generate the expression, and reset the parse node pool */
    prsgexp(ctx, exprnode);
    prsrstn(ctx);
}